

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

void duckdb::MergeUpdateLoop<unsigned_char>
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,row_t *ids,idx_t count,SelectionVector *sel)

{
  UpdateInfo *__dest;
  long lVar1;
  void *__dest_00;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  data_ptr_t pdVar5;
  sel_t *psVar6;
  SelectionVector *pSVar7;
  sel_t *psVar8;
  row_t rVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  data_t *pdVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  size_t sVar20;
  size_t sVar21;
  ulong uVar22;
  uchar result_values [2048];
  data_t local_2838 [2048];
  uint local_2038 [2050];
  
  lVar17 = base_info->vector_index * 0x800 + base_info->segment->column_data->start;
  __dest = base_info + 1;
  uVar2 = base_info->max;
  __dest_00 = (void *)((long)&base_info[1].segment + (ulong)uVar2 * 4);
  uVar3 = update_info->max;
  lVar1 = (ulong)uVar3 * 4;
  if (count == 0) {
    uVar11 = (ulong)update_info->N;
    sVar21 = 0;
    uVar22 = 0;
  }
  else {
    pdVar5 = base_data->data;
    psVar6 = sel->sel_vector;
    uVar11 = (ulong)update_info->N;
    uVar16 = (ulong)base_info->N;
    uVar18 = 0;
    uVar22 = 0;
    uVar10 = 0;
    sVar21 = 0;
    do {
      uVar15 = uVar10;
      if (psVar6 != (sel_t *)0x0) {
        uVar15 = (ulong)psVar6[uVar10];
      }
      uVar15 = ids[uVar15] - lVar17;
      sVar20 = sVar21;
      if (uVar22 < uVar11) {
        lVar12 = 0;
        do {
          uVar4 = *(uint *)((long)&update_info[1].segment + lVar12 * 4 + uVar22 * 4);
          if (uVar15 <= uVar4) {
            sVar20 = sVar21 + lVar12;
            if (uVar15 != uVar4) {
              uVar22 = uVar22 + lVar12;
              goto LAB_00622caa;
            }
            local_2838[lVar12 + sVar21] =
                 *(data_t *)((long)&update_info[1].segment + uVar22 + lVar12 + lVar1);
            local_2038[sVar21 + lVar12] = uVar4;
            uVar22 = uVar22 + 1 + lVar12;
            goto LAB_00622ceb;
          }
          local_2838[lVar12 + sVar21] =
               *(data_t *)((long)&update_info[1].segment + lVar12 + uVar22 + lVar1);
          local_2038[sVar21 + lVar12] = uVar4;
          lVar12 = lVar12 + 1;
        } while ((uVar22 - uVar11) + lVar12 != 0);
        sVar20 = sVar21 + lVar12;
        uVar22 = uVar11;
      }
LAB_00622caa:
      uVar19 = uVar18;
      if (uVar18 < uVar16) {
        do {
          uVar13 = (ulong)*(uint *)((long)&__dest->segment + uVar18 * 4);
          if (uVar15 <= uVar13) {
            uVar19 = uVar18;
            if (uVar15 == uVar13) {
              pdVar14 = (data_t *)((long)__dest_00 + uVar18);
              goto LAB_00622cd9;
            }
            break;
          }
          uVar18 = uVar18 + 1;
          uVar19 = uVar16;
        } while (uVar16 != uVar18);
      }
      pdVar14 = pdVar5 + uVar15;
      uVar18 = uVar19;
LAB_00622cd9:
      local_2838[sVar20] = *pdVar14;
      local_2038[sVar20] = (uint)uVar15;
LAB_00622ceb:
      sVar21 = sVar20 + 1;
      uVar10 = uVar10 + 1;
    } while (uVar10 != count);
  }
  pSVar7 = update->sel;
  pdVar5 = update->data;
  sVar20 = uVar11 - uVar22;
  if (uVar22 <= uVar11 && sVar20 != 0) {
    switchD_00b041bd::default
              (local_2838 + sVar21,(void *)((long)&update_info[1].segment + lVar1 + uVar22),sVar20);
    switchD_00b041bd::default
              (local_2038 + sVar21,(void *)((long)&update_info[1].segment + uVar22 * 4),sVar20 * 4);
    sVar21 = (uVar11 + sVar21) - uVar22;
  }
  update_info->N = (sel_t)sVar21;
  switchD_00b041bd::default
            ((void *)((long)&update_info[1].segment + (ulong)uVar3 * 4),local_2838,sVar21);
  switchD_00b041bd::default(update_info + 1,local_2038,sVar21 << 2);
  uVar22 = (ulong)base_info->N;
  if (count == 0 || uVar22 == 0) {
    sVar21 = 0;
    uVar18 = 0;
    uVar11 = 0;
  }
  else {
    psVar6 = sel->sel_vector;
    psVar8 = pSVar7->sel_vector;
    sVar21 = 0;
    uVar11 = 0;
    uVar18 = 0;
    do {
      uVar10 = uVar11;
      if (psVar6 != (sel_t *)0x0) {
        uVar10 = (ulong)psVar6[uVar11];
      }
      uVar16 = ids[uVar10] - lVar17;
      uVar3 = *(uint *)((long)&__dest->segment + uVar18 * 4);
      if (uVar16 == uVar3) {
        if (psVar8 != (sel_t *)0x0) {
          uVar10 = (ulong)psVar8[uVar10];
        }
        local_2838[sVar21] = pdVar5[uVar10];
        local_2038[sVar21] = (uint)uVar16;
        uVar11 = uVar11 + 1;
LAB_00622e8e:
        uVar18 = uVar18 + 1;
      }
      else {
        if (uVar3 <= uVar16) {
          local_2838[sVar21] = *(data_t *)((long)__dest_00 + uVar18);
          local_2038[sVar21] = uVar3;
          goto LAB_00622e8e;
        }
        if (psVar8 != (sel_t *)0x0) {
          uVar10 = (ulong)psVar8[uVar10];
        }
        local_2838[sVar21] = pdVar5[uVar10];
        local_2038[sVar21] = (uint)uVar16;
        uVar11 = uVar11 + 1;
      }
      sVar21 = sVar21 + 1;
    } while ((uVar11 < count) && (uVar18 < uVar22));
  }
  if (uVar11 < count) {
    psVar6 = sel->sel_vector;
    psVar8 = pSVar7->sel_vector;
    do {
      uVar10 = uVar11;
      if (psVar6 != (sel_t *)0x0) {
        uVar10 = (ulong)psVar6[uVar11];
      }
      uVar16 = uVar10;
      if (psVar8 != (sel_t *)0x0) {
        uVar16 = (ulong)psVar8[uVar10];
      }
      rVar9 = ids[uVar10];
      local_2838[sVar21] = pdVar5[uVar16];
      local_2038[sVar21] = (int)rVar9 - (int)lVar17;
      sVar21 = sVar21 + 1;
      uVar11 = uVar11 + 1;
    } while (count != uVar11);
  }
  sVar20 = uVar22 - uVar18;
  if (uVar18 <= uVar22 && sVar20 != 0) {
    switchD_00b041bd::default
              (local_2838 + sVar21,(void *)((long)&base_info[1].segment + (ulong)uVar2 * 4 + uVar18)
               ,sVar20);
    switchD_00b041bd::default
              (local_2038 + sVar21,(void *)((long)&base_info[1].segment + uVar18 * 4),sVar20 * 4);
    sVar21 = sVar21 + sVar20;
  }
  base_info->N = (sel_t)sVar21;
  switchD_00b041bd::default(__dest_00,local_2838,sVar21);
  switchD_00b041bd::default(__dest,local_2038,sVar21 << 2);
  return;
}

Assistant:

static void MergeUpdateLoop(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                            UnifiedVectorFormat &update, row_t *ids, idx_t count, const SelectionVector &sel) {
	auto base_table_data = FlatVector::GetData<T>(base_data);
	auto update_vector_data = update.GetData<T>(update);
	MergeUpdateLoopInternal<T, T>(base_info, base_table_data, update_info, *update.sel, update_vector_data, ids, count,
	                              sel);
}